

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O3

ServiceServerLinkPtr __thiscall
miniros::ServiceManager::createServiceServerLink
          (ServiceManager *this,string *service,bool persistent,string *request_md5sum,
          string *response_md5sum,M_string *header_values)

{
  pthread_mutex_t *__mutex;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  _Node *p_Var4;
  socklen_t __len;
  _Any_data *header_func;
  undefined7 in_register_00000011;
  string *name;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ServiceServerLinkPtr SVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000008;
  bool persistent_local;
  uint32_t serv_port;
  _Any_data local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  ConnectionPtr connection;
  TransportTCPPtr transport;
  TransportPtr local_60;
  string serv_host;
  
  name = (string *)CONCAT71(in_register_00000011,persistent);
  persistent_local = SUB81(request_md5sum,0);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&service[4]._M_string_length);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  if (*(char *)&service[4]._M_dataplus._M_p == '\x01') {
    (this->service_publications_).
    super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    (this->service_publications_).
    super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  }
  else {
    serv_host._M_dataplus._M_p = (pointer)&serv_host.field_2;
    serv_host._M_string_length = 0;
    serv_host.field_2._M_local_buf[0] = '\0';
    bVar2 = lookupService((ServiceManager *)service,name,&serv_host,&serv_port);
    if (bVar2) {
      local_a8._M_unused._0_8_ = (undefined8)service[5].field_2._M_allocated_capacity;
      std::__shared_ptr<miniros::TransportTCP,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<miniros::TransportTCP>,miniros::PollSet*>
                ((__shared_ptr<miniros::TransportTCP,(__gnu_cxx::_Lock_policy)2> *)&transport,
                 (allocator<miniros::TransportTCP> *)&connection,(PollSet **)&local_a8);
      std::__shared_ptr<miniros::Connection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<miniros::Connection>>
                ((__shared_ptr<miniros::Connection,(__gnu_cxx::_Lock_policy)2> *)&connection,
                 (allocator<miniros::Connection> *)&local_a8);
      ConnectionManager::addConnection((ConnectionManager *)service[6]._M_dataplus._M_p,&connection)
      ;
      local_60.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &(transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->super_Transport;
      local_60.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      if (transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      header_func = &local_a8;
      local_98._M_allocated_capacity = 0;
      local_98._8_8_ = 0;
      local_a8._M_unused._M_object =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_a8._8_8_ = 0;
      Connection::initialize
                (connection.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,&local_60,false,(HeaderReceivedFunc *)header_func);
      __len = (socklen_t)header_func;
      if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
        (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
      }
      if (local_60.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      iVar3 = TransportTCP::connect
                        (transport.
                         super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,(int)&serv_host,(sockaddr *)(ulong)serv_port,__len);
      if ((char)iVar3 == '\0') {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (createServiceServerLink::loc.initialized_ == false) {
          local_a8._M_unused._M_object = &local_98;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"miniros.service_manager","");
          console::initializeLogLocation(&createServiceServerLink::loc,(string *)&local_a8,Debug);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_unused._0_8_ != &local_98) {
            operator_delete(local_a8._M_unused._M_object,(ulong)(local_98._M_allocated_capacity + 1)
                           );
          }
        }
        if (createServiceServerLink::loc.level_ != Debug) {
          console::setLogLocationLevel(&createServiceServerLink::loc,Debug);
          console::checkLogLocationEnabled(&createServiceServerLink::loc);
        }
        if (createServiceServerLink::loc.logger_enabled_ == true) {
          pcVar1 = (name->_M_dataplus)._M_p;
          console::print((FilterBase *)0x0,createServiceServerLink::loc.logger_,
                         createServiceServerLink::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_manager.cpp"
                         ,0x10a,
                         "ServiceServerLinkPtr miniros::ServiceManager::createServiceServerLink(const std::string &, bool, const std::string &, const std::string &, const M_string &)"
                         ,"Failed to connect to service [%s] (mapped=[%s]) at [%s:%d]",pcVar1,pcVar1
                         ,serv_host._M_dataplus._M_p,(ulong)serv_port);
        }
        (this->service_publications_).
        super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
        ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
        (this->service_publications_).
        super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
        ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
      }
      else {
        std::__shared_ptr<miniros::ServiceServerLink,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<miniros::ServiceServerLink>,std::__cxx11::string_const&,bool&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&>
                  ((__shared_ptr<miniros::ServiceServerLink,(__gnu_cxx::_Lock_policy)2> *)this,
                   (allocator<miniros::ServiceServerLink> *)&local_a8,name,&persistent_local,
                   response_md5sum,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   header_values,in_stack_00000008);
        __mutex = (pthread_mutex_t *)((long)&service[2].field_2 + 8);
        iVar3 = pthread_mutex_lock(__mutex);
        if (iVar3 != 0) {
          std::__throw_system_error(iVar3);
        }
        p_Var4 = std::__cxx11::
                 list<std::shared_ptr<miniros::ServiceServerLink>,std::allocator<std::shared_ptr<miniros::ServiceServerLink>>>
                 ::_M_create_node<std::shared_ptr<miniros::ServiceServerLink>const&>
                           ((list<std::shared_ptr<miniros::ServiceServerLink>,std::allocator<std::shared_ptr<miniros::ServiceServerLink>>>
                             *)(service + 2),(shared_ptr<miniros::ServiceServerLink> *)this);
        std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
        service[2].field_2._M_allocated_capacity = service[2].field_2._M_allocated_capacity + 1;
        pthread_mutex_unlock(__mutex);
        ServiceServerLink::initialize
                  ((ServiceServerLink *)
                   (this->service_publications_).
                   super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next,&connection);
      }
      if (connection.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (connection.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    else {
      (this->service_publications_).
      super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
      (this->service_publications_).
      super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)serv_host._M_dataplus._M_p != &serv_host.field_2) {
      operator_delete(serv_host._M_dataplus._M_p,
                      CONCAT71(serv_host.field_2._M_allocated_capacity._1_7_,
                               serv_host.field_2._M_local_buf[0]) + 1);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&service[4]._M_string_length);
  SVar5.super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  SVar5.super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ServiceServerLinkPtr)
         SVar5.super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ServiceServerLinkPtr ServiceManager::createServiceServerLink(const std::string& service, bool persistent,
                                             const std::string& request_md5sum, const std::string& response_md5sum,
                                             const M_string& header_values)
{

  std::scoped_lock<std::recursive_mutex> shutdown_lock(shutting_down_mutex_);
  if (shutting_down_)
  {
    return ServiceServerLinkPtr();
  }

  uint32_t serv_port;
  std::string serv_host;
  if (!lookupService(service, serv_host, serv_port))
  {
    return ServiceServerLinkPtr();
  }

  TransportTCPPtr transport(std::make_shared<TransportTCP>(&poll_manager_->getPollSet()));

  // Make sure to initialize the connection *before* transport->connect()
  // is called, otherwise we might miss a connect error (see #434).
  ConnectionPtr connection(std::make_shared<Connection>());
  connection_manager_->addConnection(connection);
  connection->initialize(transport, false, HeaderReceivedFunc());

  if (transport->connect(serv_host, serv_port))
  {
    ServiceServerLinkPtr client(std::make_shared<ServiceServerLink>(service, persistent, request_md5sum, response_md5sum, header_values));

    {
      std::scoped_lock<std::mutex> lock(service_server_links_mutex_);
      service_server_links_.push_back(client);
    }

    client->initialize(connection);

    return client;
  }

  MINIROS_DEBUG("Failed to connect to service [%s] (mapped=[%s]) at [%s:%d]", service.c_str(), service.c_str(), serv_host.c_str(), serv_port);

  return ServiceServerLinkPtr();
}